

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O3

Leaf * __thiscall
kj::_::BTreeImpl::insertHelper<kj::_::BTreeImpl::Leaf>
          (BTreeImpl *this,SearchKey *searchKey,Leaf *node,Parent *parent,uint indexInParent,
          uint pos)

{
  Leaf *pLVar1;
  Leaf *pLVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  NodeUnion *pNVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  uint i;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint *puVar18;
  
  if (node->rows[0xd].i != 0) {
    uVar4 = this->freelistHead;
    pNVar6 = this->tree;
    pLVar1 = (Leaf *)(pNVar6 + uVar4);
    uVar5 = this->freelistSize;
    uVar15 = pNVar6[uVar4].field_0.freelist.nextOffset + uVar4 + 1;
    this->freelistHead = uVar15;
    this->freelistSize = uVar5 - 1;
    if (parent == (Parent *)0x0) {
      pLVar2 = (Leaf *)(pNVar6 + uVar15);
      this->freelistHead = pNVar6[uVar15].field_0.freelist.nextOffset + uVar15 + 1;
      this->freelistSize = uVar5 - 2;
      uVar5 = node->rows[6].i;
      uVar13 = *(undefined8 *)(node->rows + 0xc);
      puVar3 = (undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x14);
      *puVar3 = *(undefined8 *)(node->rows + 10);
      puVar3[1] = uVar13;
      uVar13 = *(undefined8 *)(node->rows + 9);
      puVar3 = (undefined8 *)((long)&pNVar6[uVar15].field_0 + 8);
      *puVar3 = *(undefined8 *)(node->rows + 7);
      puVar3[1] = uVar13;
      node->rows[10] = 0;
      node->rows[0xb] = 0;
      node->rows[0xc] = 0;
      node->rows[0xd] = 0;
      node->rows[7] = 0;
      node->rows[8] = 0;
      node->rows[9] = 0;
      node->rows[10] = 0;
      if ((ulong)node->next == 0) {
        this->endLeaf = uVar15;
        uVar16 = 0;
      }
      else {
        this->tree[node->next].field_0.freelist.zero[0] = uVar15;
        uVar16 = node->next;
      }
      pLVar2->next = uVar16;
      pLVar2->prev = pos;
      node->next = uVar15;
      uVar13 = *(undefined8 *)(node->rows + 2);
      uVar14 = *(undefined8 *)(node->rows + 4);
      uVar16 = node->rows[6].i;
      uVar7 = node->rows[7].i;
      uVar8 = node->rows[8].i;
      uVar9 = node->rows[9].i;
      uVar10 = node->rows[0xb].i;
      uVar11 = node->rows[0xc].i;
      uVar12 = node->rows[0xd].i;
      pLVar1->rows[10].i = node->rows[10].i;
      pLVar1->rows[0xb].i = uVar10;
      pLVar1->rows[0xc].i = uVar11;
      pLVar1->rows[0xd].i = uVar12;
      pLVar1->rows[6].i = uVar16;
      pLVar1->rows[7].i = uVar7;
      pLVar1->rows[8].i = uVar8;
      pLVar1->rows[9].i = uVar9;
      *(undefined8 *)(pLVar1->rows + 2) = uVar13;
      *(undefined8 *)(pLVar1->rows + 4) = uVar14;
      uVar16 = node->prev;
      uVar13 = *(undefined8 *)node->rows;
      pLVar1->next = node->next;
      pLVar1->prev = uVar16;
      *(undefined8 *)pLVar1->rows = uVar13;
      puVar18 = this->tree[node->next].field_0.freelist.zero;
      if ((ulong)node->next == 0) {
        puVar18 = &this->endLeaf;
      }
      *puVar18 = uVar4;
      if ((ulong)node->prev == 0) {
        this->beginLeaf = uVar4;
      }
      else {
        this->tree[node->prev].field_0.leaf.next = uVar4;
      }
      pNVar6 = this->tree;
      (pNVar6->field_0).freelist.zero[0] = uVar5;
      (pNVar6->field_0).freelist.zero[7] = uVar4;
      (pNVar6->field_0).freelist.zero[8] = uVar15;
      *(undefined8 *)((long)&pNVar6->field_0 + 8) = 0;
      *(undefined8 *)((long)&pNVar6->field_0 + 0x10) = 0;
      *(undefined8 *)((long)&pNVar6->field_0 + 0x18) = 0;
      *(undefined8 *)((long)&pNVar6->field_0 + 0x28) = 0;
      *(undefined8 *)((long)&pNVar6->field_0 + 0x30) = 0;
      *(undefined8 *)((long)&pNVar6->field_0 + 0x38) = 0;
      this->height = this->height + 1;
      iVar17 = (*searchKey->_vptr_SearchKey[2])(searchKey,(ulong)(uVar5 - 1));
      node = pLVar1;
      if ((char)iVar17 != '\0') {
        node = pLVar2;
      }
    }
    else {
      uVar5 = node->rows[6].i;
      uVar13 = *(undefined8 *)(node->rows + 0xc);
      *(undefined8 *)(pLVar1->rows + 3) = *(undefined8 *)(node->rows + 10);
      *(undefined8 *)(pLVar1->rows + 5) = uVar13;
      uVar13 = *(undefined8 *)(node->rows + 9);
      *(undefined8 *)pLVar1->rows = *(undefined8 *)(node->rows + 7);
      *(undefined8 *)(pLVar1->rows + 2) = uVar13;
      node->rows[10] = 0;
      node->rows[0xb] = 0;
      node->rows[0xc] = 0;
      node->rows[0xd] = 0;
      node->rows[7] = 0;
      node->rows[8] = 0;
      node->rows[9] = 0;
      node->rows[10] = 0;
      if ((ulong)node->next == 0) {
        this->endLeaf = uVar4;
        uVar16 = 0;
      }
      else {
        this->tree[node->next].field_0.freelist.zero[0] = uVar4;
        uVar16 = node->next;
      }
      pLVar1->next = uVar16;
      pLVar1->prev = pos;
      node->next = uVar4;
      memmove(parent->keys + (ulong)indexInParent + 1,parent->keys + indexInParent,
              (ulong)(indexInParent + 1) * -4 + 0x1c);
      ((Parent *)(parent->keys + (ulong)indexInParent + 1 + -1))->unused = uVar5;
      memmove(parent->children + (ulong)indexInParent + 2,
              parent->children + (ulong)indexInParent + 1,(ulong)(indexInParent + 2) * -4 + 0x20);
      parent->children[indexInParent + 1] = uVar4;
      iVar17 = (*searchKey->_vptr_SearchKey[2])(searchKey,(ulong)(uVar5 - 1));
      if ((char)iVar17 != '\0') {
        node = pLVar1;
      }
    }
  }
  return node;
}

Assistant:

Node& BTreeImpl::insertHelper(const SearchKey& searchKey,
    Node& node, Parent* parent, uint indexInParent, uint pos) {
  if (node.isFull()) {
    // This node is full. Need to split.
    if (parent == nullptr) {
      // This is the root node. We need to split into two nodes and create a new root.
      auto n1 = alloc<Node>();
      auto n2 = alloc<Node>();

      uint pivot = split(n2.node, n2.index, node, pos);
      move(n1.node, n1.index, node);

      // Rewrite root to have the two children.
      tree[0].parent.initRoot(pivot, n1.index, n2.index);

      // Increased height.
      ++height;

      // Decide which new branch has our search key.
      if (searchKey.isAfter(pivot)) {
        // the right one
        return n2.node;
      } else {
        // the left one
        return n1.node;
      }
    } else {
      // This is a non-root parent node. We need to split it into two and insert the new node
      // into the grandparent.
      auto n = alloc<Node>();
      uint pivot = split(n.node, n.index, node, pos);

      // Insert new child into grandparent.
      parent->insertAfter(indexInParent, pivot, n.index);

      // Decide which new branch has our search key.
      if (searchKey.isAfter(pivot)) {
        // the new one, which is right of the original
        return n.node;
      } else {
        // the original one, which is left of the new one
        return node;
      }
    }
  } else {
    // No split needed.
    return node;
  }
}